

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * pstore::basic_logger::get_current_thread_name_abi_cxx11_(void)

{
  __int_type_conflict2 _Var1;
  ulong uVar2;
  ostream *poVar3;
  string *in_RDI;
  long *in_FS_OFFSET;
  ostringstream local_1b8 [8];
  ostringstream str;
  string local_30 [8];
  string name;
  
  threads::get_name_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(in_RDI,local_30);
  }
  else {
    if (*(int *)(*in_FS_OFFSET + -0x10) == -1) {
      _Var1 = std::__atomic_base<int>::operator++
                        (&get_current_thread_name::nextid.super___atomic_base<int>,0);
      *(__int_type_conflict2 *)(*in_FS_OFFSET + -0x10) = _Var1;
      if (*(int *)(*in_FS_OFFSET + -0x10) == -1) {
        assert_failed("id != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                      ,0x18c);
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,'(');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(*in_FS_OFFSET + -0x10));
    std::operator<<(poVar3,')');
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string basic_logger::get_current_thread_name () {
            std::string const name = threads::get_name ();
            if (!name.empty ()) {
                return name;
            }

            // If a thread name hasn't been explicitly set (or has been explictly set
            // to an empty string), then construct something that allows us to
            // identify this thread in the logs.
            thread_local auto id = -1;
            if (id == -1) {
                static std::atomic<int> nextid;
                id = nextid++;
                PSTORE_ASSERT (id != -1);
            }

            std::ostringstream str;
            str << '(' << id << ')';
            return str.str ();
        }